

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_upstream_hash_module.c
# Opt level: O0

int ngx_stream_upstream_chash_cmp_points(void *one,void *two)

{
  ngx_stream_upstream_chash_point_t *second;
  ngx_stream_upstream_chash_point_t *first;
  void *two_local;
  void *one_local;
  
  if (*one < *two) {
    one_local._4_4_ = -1;
  }
  else if (*two < *one) {
    one_local._4_4_ = 1;
  }
  else {
    one_local._4_4_ = 0;
  }
  return one_local._4_4_;
}

Assistant:

static int ngx_libc_cdecl
ngx_stream_upstream_chash_cmp_points(const void *one, const void *two)
{
    ngx_stream_upstream_chash_point_t *first =
                                     (ngx_stream_upstream_chash_point_t *) one;
    ngx_stream_upstream_chash_point_t *second =
                                     (ngx_stream_upstream_chash_point_t *) two;

    if (first->hash < second->hash) {
        return -1;

    } else if (first->hash > second->hash) {
        return 1;

    } else {
        return 0;
    }
}